

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEnginePrivate::nativeSetMulticastInterface
          (QNativeSocketEnginePrivate *this,QNetworkInterface *iface)

{
  long lVar1;
  NetworkLayerProtocol NVar2;
  quint32 qVar3;
  int iVar4;
  char *pcVar5;
  in_addr *__optval;
  int in_EDX;
  int __optname;
  int __level;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QNetworkAddressEntry local_60;
  uint v_1;
  undefined4 uStack_54;
  QNetworkAddressEntry *pQStack_50;
  undefined1 *local_48;
  in_addr v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)((this->super_QAbstractSocketEnginePrivate).socketProtocol + UnknownNetworkLayerProtocol
            ) < 2) {
    pcVar5 = QNetworkInterface::index((QNetworkInterface *)iface,(char *)iface,in_EDX);
    __optval = (in_addr *)&v_1;
    _v_1 = (Data *)CONCAT44(uStack_54,(int)pcVar5);
    iVar4 = (int)this->socketDescriptor;
    __level = 0x29;
    __optname = 0x11;
  }
  else {
    v.s_addr = 0xaaaaaaaa;
    bVar7 = QNetworkInterface::isValid((QNetworkInterface *)iface);
    if (bVar7) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      _v_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkInterface::addressEntries
                ((QList<QNetworkAddressEntry> *)&v_1,(QNetworkInterface *)iface);
      for (puVar6 = (undefined1 *)0x0; bVar7 = puVar6 < local_48, puVar6 < local_48;
          puVar6 = puVar6 + 1) {
        QNetworkAddressEntry::ip(&local_60);
        NVar2 = QHostAddress::protocol((QHostAddress *)&local_60);
        if (NVar2 == IPv4Protocol) {
          qVar3 = QHostAddress::toIPv4Address((QHostAddress *)&local_60,(bool *)0x0);
          v.s_addr = qVar3 >> 0x18 | (qVar3 & 0xff0000) >> 8 | (qVar3 & 0xff00) << 8 | qVar3 << 0x18
          ;
          iVar4 = setsockopt((int)this->socketDescriptor,0,0x20,&v,4);
          if (iVar4 != -1) {
            QHostAddress::~QHostAddress((QHostAddress *)&local_60);
            break;
          }
        }
        QHostAddress::~QHostAddress((QHostAddress *)&local_60);
      }
      QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer
                ((QArrayDataPointer<QNetworkAddressEntry> *)&v_1);
      goto LAB_0021724b;
    }
    __optval = &v;
    v.s_addr = 0;
    iVar4 = (int)this->socketDescriptor;
    __optname = 0x20;
    __level = 0;
  }
  iVar4 = setsockopt(iVar4,__level,__optname,__optval,4);
  bVar7 = iVar4 != -1;
LAB_0021724b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeSetMulticastInterface(const QNetworkInterface &iface)
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v = iface.index();
        return (::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, sizeof(v)) != -1);
    }

    struct in_addr v;
    if (iface.isValid()) {
        QList<QNetworkAddressEntry> entries = iface.addressEntries();
        for (int i = 0; i < entries.size(); ++i) {
            const QNetworkAddressEntry &entry = entries.at(i);
            const QHostAddress &ip = entry.ip();
            if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                v.s_addr = htonl(ip.toIPv4Address());
                int r = ::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v));
                if (r != -1)
                    return true;
            }
        }
        return false;
    }

    v.s_addr = INADDR_ANY;
    return (::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v)) != -1);
}